

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateWithTransport(IOTHUB_CLIENT_DEVICE_CONFIG *config)

{
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar1;
  LOGGER_LOG p_Var2;
  
  if ((((config != (IOTHUB_CLIENT_DEVICE_CONFIG *)0x0) &&
       (config->protocol != (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) &&
      (config->transportHandle != (void *)0x0)) &&
     ((config->deviceKey != (char *)0x0 || (config->deviceSasToken != (char *)0x0)))) {
    pIVar1 = initialize_iothub_client((IOTHUB_CLIENT_CONFIG *)0x0,config,false,(char *)0x0);
    return pIVar1;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_CreateWithTransport",0x6f3,1,
              "invalid configuration (NULL detected)");
  }
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateWithTransport(const IOTHUB_CLIENT_DEVICE_CONFIG * config)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if (
        (config == NULL) ||
        (config->protocol == NULL) ||
        (config->transportHandle == NULL) ||
        ((config->deviceKey == NULL) && (config->deviceSasToken == NULL))
        )
    {
        result = NULL;
        LogError("invalid configuration (NULL detected)");
    }
    else
    {
        result = initialize_iothub_client(NULL, config, false, NULL);
    }
    return result;
}